

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_notation.cpp
# Opt level: O0

ScientificNotation icu_63::number::Notation::scientific(void)

{
  Notation NVar1;
  NotationType local_2c;
  NotationUnion local_28;
  NotationUnion union_;
  undefined4 uStack_18;
  ScientificSettings settings;
  undefined4 local_c;
  
  union_.scientific.fExponentSignDisplay._0_1_ = 1;
  union_.scientific.fExponentSignDisplay._1_1_ = 0;
  union_.scientific.fExponentSignDisplay._2_2_ = 1;
  uStack_18 = 0;
  local_28 = (NotationUnion)0x10001;
  local_2c = NTN_SCIENTIFIC;
  ScientificNotation::Notation((ScientificNotation *)&settings,&local_2c,&local_28);
  NVar1.fUnion.scientific.fExponentSignDisplay = local_c;
  NVar1._0_8_ = settings;
  return (ScientificNotation)NVar1;
}

Assistant:

ScientificNotation Notation::scientific() {
    // NOTE: ISO C++ does not allow C99 designated initializers.
    ScientificSettings settings;
    settings.fEngineeringInterval = 1;
    settings.fRequireMinInt = false;
    settings.fMinExponentDigits = 1;
    settings.fExponentSignDisplay = UNUM_SIGN_AUTO;
    NotationUnion union_;
    union_.scientific = settings;
    return {NTN_SCIENTIFIC, union_};
}